

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Choice.cpp
# Opt level: O1

void __thiscall Inferences::Choice::AxiomsIterator::AxiomsIterator(AxiomsIterator *this,Term *term)

{
  Iterator it;
  TermList TVar1;
  ulong uVar2;
  undefined4 uStack_14;
  
  (this->_choiceOps)._map._timestamp = 1;
  (this->_choiceOps)._map._size = 0;
  (this->_choiceOps)._map._deleted = 0;
  (this->_choiceOps)._map._capacityIndex = 0;
  (this->_choiceOps)._map._capacity = 0;
  *(undefined8 *)&(this->_choiceOps)._map._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_choiceOps)._map._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_choiceOps)._map._afterLast + 4) = 0;
  (this->_opApplied)._content = 2;
  (this->_setApplied)._content = 2;
  (this->_nextChoiceOperator)._content = 2;
  (this->_resultSort)._content = 2;
  (this->_headSort)._content = 2;
  (this->_set)._content = 2;
  (this->_set)._content = term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content;
  uVar2 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff);
  TVar1 = Kernel::AtomicSort::arrowSort(term->_args[uVar2]._content,term->_args[uVar2 - 1]._content)
  ;
  (this->_headSort)._content = TVar1._content;
  TVar1 = ApplicativeHelper::getResultApplieadToNArgs(TVar1,1);
  (this->_resultSort)._content = TVar1._content;
  it._mit._base._20_4_ = uStack_14;
  it._mit._base._timestamp = *(undefined4 *)(DAT_00b7e1b0 + 0xb8);
  it._mit._base._0_16_ = *(undefined1 (*) [16])(DAT_00b7e1b0 + 0xd0);
  ::Lib::DHSet<unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::
  loadFromIterator<Lib::DHSet<unsigned_int,Lib::DefaultHash,Lib::DefaultHash2>::Iterator>
            ((DHSet<unsigned_int,Lib::DefaultHash,Lib::DefaultHash2> *)this,it);
  this->_inBetweenNextandHasNext = false;
  return;
}

Assistant:

AxiomsIterator(Term* term)
  {
    _set = *term->nthArgument(3);
    _headSort = AtomicSort::arrowSort(*term->nthArgument(0),*term->nthArgument(1));
    _resultSort = ApplicativeHelper::getResultApplieadToNArgs(_headSort, 1);

    //cout << "the result sort is " + _resultSort.toString() << endl;

    DHSet<unsigned>* ops = env.signature->getChoiceOperators();
    DHSet<unsigned>::Iterator opsIt(*ops);
    _choiceOps.loadFromIterator(opsIt);
    _inBetweenNextandHasNext = false;
  }